

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

void __thiscall
banksia::ChessBoard::gen_addPawnMove
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          int from,int dest,bool captureOnly)

{
  pointer *ppMVar1;
  pointer pPVar2;
  iterator iVar3;
  PieceType PVar4;
  ulong uVar5;
  Side SVar6;
  ulong uVar7;
  ulong uVar8;
  MoveFull local_34;
  
  uVar8 = (ulong)dest;
  pPVar2 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->super_BoardCore).pieces.
                super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pPVar2 >> 3;
  uVar5 = uVar8;
  if ((uVar8 < uVar7) && (uVar5 = (ulong)from, uVar5 < uVar7)) {
    SVar6 = pPVar2[uVar5].side;
    if ((SVar6 != pPVar2[uVar8].side) && ((ulong)pPVar2[uVar8] >> 0x20 != 2 || !captureOnly)) {
      local_34.piece.type = pPVar2[uVar5].type;
      PVar4 = local_34.piece.type;
      if (dest - 8U < 0x30) {
        local_34.super_Move.promotion = empty;
      }
      else {
        local_34.super_Move.promotion = queen;
        iVar3._M_current =
             (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_34.super_Move.from = from;
          local_34.super_Move.dest = dest;
          local_34.piece.side = SVar6;
          std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
          _M_realloc_insert<banksia::MoveFull>(moveList,iVar3,&local_34);
        }
        else {
          ((iVar3._M_current)->piece).side = SVar6;
          ((iVar3._M_current)->super_Move).from = from;
          ((iVar3._M_current)->super_Move).dest = dest;
          *(ulong *)&((iVar3._M_current)->super_Move).promotion = CONCAT44(local_34.piece.type,2);
          ppMVar1 = &(moveList->
                     super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        local_34.super_Move.promotion = rook;
        iVar3._M_current =
             (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_34.super_Move.from = from;
          local_34.super_Move.dest = dest;
          local_34.piece.type = PVar4;
          local_34.piece.side = SVar6;
          std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
          _M_realloc_insert<banksia::MoveFull>(moveList,iVar3,&local_34);
        }
        else {
          ((iVar3._M_current)->piece).side = SVar6;
          ((iVar3._M_current)->super_Move).from = from;
          ((iVar3._M_current)->super_Move).dest = dest;
          *(ulong *)&((iVar3._M_current)->super_Move).promotion = CONCAT44(PVar4,3);
          ppMVar1 = &(moveList->
                     super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        local_34.super_Move.promotion = bishop;
        iVar3._M_current =
             (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_34.super_Move.from = from;
          local_34.super_Move.dest = dest;
          local_34.piece.type = PVar4;
          local_34.piece.side = SVar6;
          std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
          _M_realloc_insert<banksia::MoveFull>(moveList,iVar3,&local_34);
        }
        else {
          ((iVar3._M_current)->piece).side = SVar6;
          ((iVar3._M_current)->super_Move).from = from;
          ((iVar3._M_current)->super_Move).dest = dest;
          *(ulong *)&((iVar3._M_current)->super_Move).promotion = CONCAT44(PVar4,4);
          ppMVar1 = &(moveList->
                     super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        local_34.super_Move.promotion = knight;
      }
      iVar3._M_current =
           (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_34.super_Move.from = from;
        local_34.super_Move.dest = dest;
        local_34.piece.type = PVar4;
        local_34.piece.side = SVar6;
        std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
        _M_realloc_insert<banksia::MoveFull>(moveList,iVar3,&local_34);
      }
      else {
        ((iVar3._M_current)->piece).side = SVar6;
        ((iVar3._M_current)->super_Move).from = from;
        ((iVar3._M_current)->super_Move).dest = dest;
        *(ulong *)&((iVar3._M_current)->super_Move).promotion =
             CONCAT44(PVar4,local_34.super_Move.promotion);
        ppMVar1 = &(moveList->
                   super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

void ChessBoard::gen_addPawnMove(std::vector<MoveFull>& moveList, int from, int dest, bool captureOnly) const
{
    auto toSide = getPiece(dest).side;
    auto movingPiece = getPiece(from);
    auto fromSide = movingPiece.side;
    
    assert(movingPiece.type == PieceType::pawn);
    if (fromSide != toSide && (!captureOnly || toSide != Side::none)) {
        if (dest >= 8 && dest < 56) {
            moveList.push_back(MoveFull(movingPiece, from, dest));
        } else {
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::queen));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::rook));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::bishop));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::knight));
        }
    }
}